

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O3

int __thiscall MPLSParser::pgIndexToFullIndex(MPLSParser *this,int value)

{
  pointer pMVar1;
  StreamType *pSVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  
  pMVar1 = (this->m_streamInfo).super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->m_streamInfo).
                super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pMVar1;
  if (lVar3 != 0) {
    lVar3 = (lVar3 >> 4) * 0x6db6db6db6db6db7;
    pSVar2 = &(pMVar1->super_M2TSStreamInfo).stream_coding_type;
    lVar4 = 0;
    iVar5 = 0;
    do {
      if (*pSVar2 == SUB_PGS) {
        if (iVar5 == value) {
          return (int)lVar4;
        }
        iVar5 = iVar5 + 1;
      }
      lVar4 = lVar4 + 1;
      pSVar2 = pSVar2 + 0x1c;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar4);
  }
  return -1;
}

Assistant:

int MPLSParser::pgIndexToFullIndex(const int value) const
{
    int cnt = 0;
    for (size_t i = 0; i < m_streamInfo.size(); ++i)
    {
        if (m_streamInfo[i].stream_coding_type == StreamType::SUB_PGS)
        {
            if (cnt++ == value)
                return static_cast<int>(i);
        }
    }
    return -1;
}